

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r,int skip)

{
  aom_cdf_prob *paVar1;
  _Bool _Var2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  FRAME_CONTEXT *pFVar9;
  short sVar10;
  uint uVar11;
  int iVar12;
  uint ref;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  aom_cdf_prob (*icdf) [9];
  
  iVar12 = xd->mi_row;
  iVar5 = xd->mi_col;
  puVar8 = cm->cur_frame->seg_map;
  _Var2 = xd->left_available;
  if (xd->up_available == false) {
    uVar11 = 0xff;
    ref = 0xff;
    uVar15 = 0xff;
    if ((_Var2 & 1U) != 0) goto LAB_0017da3f;
  }
  else {
    iVar6 = (cm->mi_params).mi_rows;
    iVar7 = (cm->mi_params).mi_cols;
    uVar11 = 0xff;
    if (((_Var2 & 1U) != 0) && (uVar11 = 8, iVar5 <= iVar7 && iVar12 <= iVar6)) {
      bVar17 = 8;
      if (puVar8[(iVar12 + -1) * iVar7 + iVar5 + -1] < 8) {
        bVar17 = puVar8[(iVar12 + -1) * iVar7 + iVar5 + -1];
      }
      uVar11 = (uint)bVar17;
    }
    if (iVar5 < iVar7 && iVar12 <= iVar6) {
      ref = 8;
      if (puVar8[iVar7 * (iVar12 + -1) + iVar5] < 8) {
        ref = (uint)puVar8[iVar7 * (iVar12 + -1) + iVar5];
      }
    }
    else {
      ref = 8;
    }
    uVar15 = 0xff;
    if ((_Var2 & 1U) != 0) {
LAB_0017da3f:
      iVar6 = (cm->mi_params).mi_cols;
      uVar15 = 8;
      if (iVar5 <= iVar6 && iVar12 < (cm->mi_params).mi_rows) {
        bVar17 = 8;
        if (puVar8[iVar5 + iVar6 * iVar12 + -1] < 8) {
          bVar17 = puVar8[iVar5 + iVar6 * iVar12 + -1];
        }
        uVar15 = (uint)bVar17;
      }
    }
    if (uVar11 != 0xff) {
      if ((uVar11 != ref) || (uVar13 = 2, uVar14 = uVar11, uVar11 != uVar15)) {
        uVar13 = (ulong)((uVar15 == ref || uVar11 == uVar15) || uVar11 == ref);
        uVar14 = ref;
      }
      goto LAB_0017dacc;
    }
  }
  uVar11 = 0xff;
  uVar13 = 0;
  uVar14 = ref;
LAB_0017dacc:
  if ((char)ref == -1) {
    ref = 0;
    if (uVar15 != 0xff) {
      ref = uVar15;
    }
  }
  else if ((uVar15 != 0xff) && (ref = uVar15, uVar11 == uVar14)) {
    ref = uVar14;
  }
  if (skip == 0) {
    pFVar9 = xd->tile_ctx;
    icdf = (pFVar9->seg).spatial_pred_seg_cdf + uVar13;
    iVar12 = od_ec_decode_cdf_q15(&r->ec,*icdf,8);
    if (r->allow_update_cdf != '\0') {
      uVar3 = (pFVar9->seg).spatial_pred_seg_cdf[uVar13][8];
      bVar17 = (char)(uVar3 >> 4) + 5;
      lVar16 = 0;
      do {
        uVar4 = (*icdf)[lVar16];
        if (lVar16 < (char)iVar12) {
          sVar10 = (short)((int)(0x8000 - (uint)uVar4) >> (bVar17 & 0x1f));
        }
        else {
          sVar10 = -(uVar4 >> (bVar17 & 0x1f));
        }
        (*icdf)[lVar16] = sVar10 + uVar4;
        lVar16 = lVar16 + 1;
      } while (lVar16 != 7);
      paVar1 = (pFVar9->seg).spatial_pred_seg_cdf[uVar13] + 8;
      *paVar1 = *paVar1 + (ushort)(uVar3 < 0x20);
    }
    iVar5 = (cm->seg).last_active_segid;
    ref = av1_neg_deinterleave(iVar12,ref,iVar5 + 1);
    if ((int)ref < 0 || iVar5 < (int)ref) {
      aom_internal_error(xd->error_info,AOM_CODEC_CORRUPT_FRAME,"Corrupted segment_ids");
    }
  }
  return ref;
}

Assistant:

static int read_segment_id(AV1_COMMON *const cm, const MACROBLOCKD *const xd,
                           aom_reader *r, int skip) {
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(cm, xd, &cdf_num, 0);
  if (skip) return pred;

  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  struct segmentation *const seg = &cm->seg;
  struct segmentation_probs *const segp = &ec_ctx->seg;
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  const int coded_id = aom_read_symbol(r, pred_cdf, MAX_SEGMENTS, ACCT_STR);
  const int segment_id =
      av1_neg_deinterleave(coded_id, pred, seg->last_active_segid + 1);

  if (segment_id < 0 || segment_id > seg->last_active_segid) {
    aom_internal_error(xd->error_info, AOM_CODEC_CORRUPT_FRAME,
                       "Corrupted segment_ids");
  }
  return segment_id;
}